

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

LClosure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pTVar1;
  LClosure *o;
  Table *pTVar2;
  Proto *pPVar3;
  Table *x__1;
  TValue *io_1;
  LClosure *x_;
  TValue *io;
  LClosure *cl;
  FuncState funcstate;
  LexState lexstate;
  int firstchar_local;
  char *name_local;
  Dyndata *dyd_local;
  Mbuffer *buff_local;
  ZIO *z_local;
  lua_State *L_local;
  
  o = luaF_newLclosure(L,1);
  pTVar1 = L->top;
  if (9 < (o->tt & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                  ,0x9d7,
                  "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                 );
  }
  (pTVar1->value_).gc = (GCObject *)o;
  pTVar1->tt_ = 0x8006;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x9d7,
                    "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                   );
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0014d935:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x9d7,
                    "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                   );
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                      ,0x9d7,
                      "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                     );
      }
      if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0014d935;
    }
  }
  luaD_inctop(L);
  pTVar2 = luaH_new(L);
  pTVar1 = L->top;
  if (9 < (pTVar2->tt & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                  ,0x9da,
                  "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                 );
  }
  (pTVar1->value_).gc = (GCObject *)pTVar2;
  pTVar1->tt_ = 0x8005;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x9da,
                    "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                   );
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0014dab4:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x9da,
                    "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                   );
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                      ,0x9da,
                      "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                     );
      }
      if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0014dab4;
    }
  }
  luaD_inctop(L);
  cl = (LClosure *)luaF_newproto(L);
  o->p = (Proto *)cl;
  if (((o->marked & 0x20) != 0) && ((o->p->marked & 0x18) != 0)) {
    if (9 < (o->tt & 0xf)) {
      __assert_fail("(((cl)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x9dd,
                    "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                   );
    }
    if (9 < (o->p->tt & 0xf)) {
      __assert_fail("(((cl->p)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x9dd,
                    "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                   );
    }
    luaC_barrier_(L,(GCObject *)o,(GCObject *)o->p);
  }
  pPVar3 = (Proto *)luaS_new(L,name);
  cl[2].p = pPVar3;
  if (((cl->marked & 0x20) != 0) && (((cl[2].p)->marked & 0x18) != 0)) {
    if (9 < (cl->tt & 0xf)) {
      __assert_fail("(((funcstate.f)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x9df,
                    "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                   );
    }
    if (9 < ((cl[2].p)->tt & 0xf)) {
      __assert_fail("(((funcstate.f->source)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x9df,
                    "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                   );
    }
    luaC_barrier_(L,(GCObject *)cl,(GCObject *)cl[2].p);
  }
  (dyd->label).n = 0;
  (dyd->gt).n = 0;
  (dyd->actvar).n = 0;
  luaX_setinput(L,(LexState *)&funcstate.nlocvars,z,(TString *)cl[2].p,firstchar);
  mainfunc((LexState *)&funcstate.nlocvars,(FuncState *)&cl);
  if (((funcstate.f != (Proto *)0x0) || (funcstate.np._3_1_ != '\x01')) ||
     (lexstate.lookahead.seminfo.i != 0)) {
    __assert_fail("!funcstate.prev && funcstate.nups == 1 && !lexstate.fs",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                  ,0x9e5,
                  "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
                 );
  }
  if ((((dyd->actvar).n == 0) && ((dyd->gt).n == 0)) && ((dyd->label).n == 0)) {
    L->top = L->top + -1;
    return o;
  }
  __assert_fail("dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x9e7,
                "LClosure *luaY_parser(lua_State *, ZIO *, Mbuffer *, Dyndata *, const char *, int)"
               );
}

Assistant:

LClosure *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff,
                       Dyndata *dyd, const char *name, int firstchar) {
  LexState lexstate;
  FuncState funcstate;
  LClosure *cl = luaF_newLclosure(L, 1);  /* create main closure */
  setclLvalue(L, L->top, cl);  /* anchor it (to avoid being collected) */
  luaD_inctop(L);
  lexstate.h = luaH_new(L);  /* create table for scanner */
  sethvalue(L, L->top, lexstate.h);  /* anchor it */
  luaD_inctop(L);
  funcstate.f = cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
  luaC_objbarrier(L, funcstate.f, funcstate.f->source);
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
  luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
  mainfunc(&lexstate, &funcstate);
  lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
  /* all scopes should be correctly finished */
  lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
  L->top--;  /* remove scanner's table */
  return cl;  /* closure is on the stack, too */
}